

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O2

string * __thiscall
HighsIis::iisBoundStatusToString_abi_cxx11_
          (string *__return_storage_ptr__,HighsIis *this,HighsInt bound_status)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(bound_status) {
  case 0:
    pcVar2 = "   Null";
    paVar1 = &local_a;
    break;
  case 1:
    pcVar2 = "   Free";
    paVar1 = &local_b;
    break;
  case 2:
    pcVar2 = "  Lower";
    paVar1 = &local_c;
    break;
  case 3:
    pcVar2 = "  Upper";
    paVar1 = &local_d;
    break;
  case 4:
    pcVar2 = "  Boxed";
    paVar1 = &local_e;
    break;
  case -1:
    pcVar2 = "Dropped";
    paVar1 = &local_9;
    break;
  default:
    pcVar2 = "*****";
    paVar1 = &local_f;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string HighsIis::iisBoundStatusToString(HighsInt bound_status) const {
  if (bound_status == kIisBoundStatusDropped) return "Dropped";
  if (bound_status == kIisBoundStatusNull) return "   Null";
  if (bound_status == kIisBoundStatusFree) return "   Free";
  if (bound_status == kIisBoundStatusLower) return "  Lower";
  if (bound_status == kIisBoundStatusUpper) return "  Upper";
  if (bound_status == kIisBoundStatusBoxed) return "  Boxed";
  return "*****";
}